

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFun.cpp
# Opt level: O0

float Imath_3_2::predf(float f)

{
  bool bVar1;
  float in_XMM0_Da;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  double dVar3;
  undefined4 local_14;
  
  bVar1 = std::isfinite(in_XMM0_Da);
  local_14 = in_XMM0_Da;
  if (bVar1) {
    fVar2 = std::numeric_limits<float>::infinity();
    dVar3 = std::nextafter((double)(ulong)(uint)in_XMM0_Da,
                           (double)(CONCAT44(extraout_XMM0_Db,fVar2) ^ 0x8000000080000000));
    local_14 = SUB84(dVar3,0);
  }
  return local_14;
}

Assistant:

float predf(float f) IMATH_NOEXCEPT
{
    return std::isfinite(f) ?
            std::nextafter(f, -std::numeric_limits<float>::infinity()) : f;
}